

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::focusInEvent(QGraphicsScene *this,QFocusEvent *focusEvent)

{
  uint *puVar1;
  QGraphicsItem *this_00;
  char cVar2;
  int iVar3;
  FocusReason focusReason;
  undefined8 uVar5;
  long lVar4;
  
  lVar4 = *(long *)(this + 8);
  puVar1 = (uint *)(lVar4 + 0xb8);
  *puVar1 = *puVar1 | 0x400;
  iVar3 = QFocusEvent::reason();
  if (iVar3 == 2) {
    lVar4 = *(long *)this;
    uVar5 = 0;
  }
  else {
    if (iVar3 != 1) {
      this_00 = *(QGraphicsItem **)(lVar4 + 0x198);
      if (this_00 == (QGraphicsItem *)0x0) {
        return;
      }
      focusReason = QFocusEvent::reason();
      QGraphicsItem::setFocus(this_00,focusReason);
      return;
    }
    lVar4 = *(long *)this;
    uVar5 = 1;
  }
  cVar2 = (**(code **)(lVar4 + 0x100))(this,uVar5);
  if (cVar2 == '\0') {
    focusEvent[0xc] = (QFocusEvent)0x0;
  }
  return;
}

Assistant:

void QGraphicsScene::focusInEvent(QFocusEvent *focusEvent)
{
    Q_D(QGraphicsScene);

    d->hasFocus = true;
    switch (focusEvent->reason()) {
    case Qt::TabFocusReason:
        if (!focusNextPrevChild(true))
            focusEvent->ignore();
        break;
    case Qt::BacktabFocusReason:
        if (!focusNextPrevChild(false))
            focusEvent->ignore();
        break;
    default:
        if (d->passiveFocusItem) {
            // Set focus on the last focus item
            setFocusItem(d->passiveFocusItem, focusEvent->reason());
        }
        break;
    }
}